

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileEncoding.cpp
# Opt level: O2

bool Assimp::STEP::StringToUTF8(string *s)

{
  byte *pbVar1;
  char *pcVar2;
  char *pcVar3;
  pointer pcVar4;
  byte bVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  size_t k;
  uint32_t unival;
  uint uStack_54;
  uchar temp [5];
  
  pcVar17 = (char *)0x0;
  while (pcVar3 = (char *)s->_M_string_length, pcVar17 < pcVar3) {
    pcVar4 = (s->_M_dataplus)._M_p;
    if (pcVar17[(long)pcVar4] == '\\') {
      pbVar1 = (byte *)(pcVar17 + (long)pcVar4);
      pcVar2 = pcVar17 + 3;
      if (((pcVar2 < pcVar3) && (pcVar17[(long)(pcVar4 + 1)] == 'S')) &&
         (pcVar17[(long)(pcVar4 + 2)] == '\\')) {
        bVar5 = pcVar2[(long)pcVar4];
        if ((char)bVar5 < '\0') {
          __assert_fail("(uint8_t)s[i+3] < 0x80",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/STEPParser/STEPFileEncoding.cpp"
                        ,0x12a,"bool Assimp::STEP::StringToUTF8(std::string &)");
        }
        *pbVar1 = bVar5 >> 6 | 0xc2;
        (pcVar17 + 1)[(long)(s->_M_dataplus)._M_p] = bVar5 & 0x3f | 0x80;
        std::__cxx11::string::erase((ulong)s,(ulong)(pcVar17 + 2));
        pcVar17 = pcVar17 + 1;
        goto LAB_005aa554;
      }
      pcVar18 = pcVar17 + 4;
      if (((pcVar18 < pcVar3) && (pbVar1[1] == 0x58)) && (pbVar1[2] == 0x5c)) {
        bVar5 = HexOctetToDecimal((char *)(pbVar1 + 3));
        if (0x1f < bVar5) {
          unival = (uint)mac_codetable[bVar5 - 0x20];
          utf8::utf32to8<unsigned_char*,unsigned_int_const*>(&unival,&uStack_54,temp);
          std::__cxx11::string::erase((ulong)s,(ulong)pcVar17);
          std::__cxx11::string::insert((ulong)s,pcVar17,(ulong)temp);
          goto LAB_005aa554;
        }
        break;
      }
      if (((pcVar3 <= pcVar2) || (pbVar1[1] != 0x58)) ||
         (bVar5 = pbVar1[2], 9 < (byte)(bVar5 - 0x30))) goto LAB_005aa554;
      if ((bVar5 != 0x34) && (bVar5 != 0x32)) break;
      if (pcVar2[(long)pcVar4] != '\\') goto LAB_005aa554;
      pcVar2 = pcVar3 + -3;
      pcVar12 = pcVar18;
      pcVar14 = pcVar18;
      if (pcVar18 < pcVar2) {
        pcVar14 = pcVar2;
      }
      for (; (pcVar15 = pcVar14, pcVar12 < pcVar2 &&
             ((((pcVar12[(long)pcVar4] != '\\' || (pcVar12[(long)(pcVar4 + 1)] != 'X')) ||
               (pcVar12[(long)(pcVar4 + 2)] != '0')) ||
              (pcVar15 = pcVar12, pcVar12[(long)(pcVar4 + 3)] != '\\')))); pcVar12 = pcVar12 + 1) {
      }
      if (pcVar15 == pcVar2) break;
      uVar16 = (long)pcVar15 - (long)pcVar18;
      if (uVar16 == 0) {
        std::__cxx11::string::erase((ulong)s,(ulong)pcVar17);
      }
      else if (bVar5 == 0x34) {
        if ((uVar16 & 7) != 0) break;
        uVar13 = uVar16 >> 3;
        _temp = (unsigned_short *)operator_new__(uVar16 >> 1);
        pcVar18 = pcVar18 + (long)pcVar4;
        for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
          bVar5 = HexOctetToDecimal(pcVar18);
          bVar8 = HexOctetToDecimal(pcVar18 + 2);
          bVar9 = HexOctetToDecimal(pcVar18 + 4);
          bVar10 = HexOctetToDecimal(pcVar18 + 6);
          *(uint *)((long)_temp + uVar16 * 4) =
               (uint)bVar10 | (uint)bVar9 << 8 | (uint)bVar8 << 0x10 | (uint)bVar5 << 0x18;
          pcVar18 = pcVar18 + 8;
        }
        _Var11.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
             operator_new__(uVar13 * 5);
        _unival = (uchar *)_Var11.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        utf8::utf32to8<unsigned_char*,unsigned_int_const*>
                  ((uint *)_temp,(uint *)((long)_temp + uVar13 * 4),
                   (uchar *)_Var11.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
        lVar19 = (long)_Var11.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl - (long)_unival;
        std::__cxx11::string::erase((ulong)s,(ulong)pcVar17);
        std::__cxx11::string::insert((ulong)s,pcVar17,(ulong)_unival);
        pcVar17 = pcVar17 + lVar19;
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&unival);
        std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)temp);
      }
      else {
        if (bVar5 != 0x32) goto LAB_005aa554;
        if ((uVar16 & 3) != 0) break;
        uVar13 = uVar16 >> 2;
        _temp = (unsigned_short *)operator_new__(uVar16 >> 1);
        pcVar18 = pcVar18 + (long)pcVar4;
        for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
          uVar6 = HexOctetToDecimal(pcVar18);
          uVar7 = HexOctetToDecimal(pcVar18 + 2);
          *(_temp + uVar16 * 2) = CONCAT11(uVar6,uVar7);
          pcVar18 = pcVar18 + 4;
        }
        _Var11.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
             operator_new__(uVar13 * 3);
        _unival = (uchar *)_Var11.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        utf8::utf16to8<unsigned_short_const*,unsigned_char*>
                  (_temp,_temp + uVar13 * 2,
                   (uchar *)_Var11.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
        lVar19 = (long)_Var11.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl - (long)_unival;
        std::__cxx11::string::erase((ulong)s,(ulong)pcVar17);
        std::__cxx11::string::insert((ulong)s,pcVar17,(ulong)_unival);
        pcVar17 = pcVar17 + lVar19;
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&unival);
        std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)temp);
      }
    }
    else {
LAB_005aa554:
      pcVar17 = pcVar17 + 1;
    }
  }
  return pcVar3 <= pcVar17;
}

Assistant:

bool STEP::StringToUTF8(std::string& s)
{
    // very basic handling for escaped string sequences
    // http://doc.spatial.com/index.php?title=InterOp:Connect/STEP&redirect=no

    for (size_t i = 0; i < s.size(); ) {
        if (s[i] == '\\') {
            // \S\X - cp1252 (X is the character remapped to [0,127])
            if (i+3 < s.size() && s[i+1] == 'S' && s[i+2] == '\\') {
                // http://stackoverflow.com/questions/5586214/how-to-convert-char-from-iso-8859-1-to-utf-8-in-c-multiplatformly
                ai_assert((uint8_t)s[i+3] < 0x80);
                const uint8_t ch = s[i+3] + 0x80;

                s[i] = 0xc0 | (ch & 0xc0) >> 6;
                s[i+1] =  0x80 | (ch & 0x3f);

                s.erase(i + 2,2);
                ++i;
            }
            // \X\xx - mac/roman (xx is a hex sequence)
            else if (i+4 < s.size() && s[i+1] == 'X' && s[i+2] == '\\') {

                const uint8_t macval = HexOctetToDecimal(s.c_str() + i + 3);
                if(macval < 0x20) {
                    return false;
                }

                ai_assert(sizeof(mac_codetable) / sizeof(mac_codetable[0]) == 0x100-0x20);

                const uint32_t unival = mac_codetable[macval - 0x20], *univalp = &unival;

                unsigned char temp[5], *tempp = temp;
                ai_assert(sizeof( unsigned char ) == 1);

                utf8::utf32to8( univalp, univalp + 1, tempp );

                const size_t outcount = static_cast<size_t>(tempp-temp);

                s.erase(i,5);
                s.insert(i, reinterpret_cast<char*>(temp), outcount);
                i += outcount;
            }
            // \Xn\ .. \X0\ - various unicode encodings (n=2: utf16; n=4: utf32)
            else if (i+3 < s.size() && s[i+1] == 'X' && s[i+2] >= '0' && s[i+2] <= '9') {
                switch(s[i+2]) {
                    // utf16
                case '2':
                    // utf32
                case '4':
                    if (s[i+3] == '\\') {
                        const size_t basei = i+4;
                        size_t j = basei, jend = s.size()-3;

                        for (; j < jend; ++j) {
                            if (s[j] == '\\' && s[j+1] == 'X' && s[j+2] == '0' && s[j+3] == '\\') {
                                break;
                            }
                        }
                        if (j == jend) {
                            return false;
                        }

                        if (j == basei) {
                            s.erase(i,8);
                            continue;
                        }

                        if (s[i+2] == '2') {
                            if (((j - basei) % 4) != 0) {
                                return false;
                            }

                            const size_t count = (j-basei)/4;
                            std::unique_ptr<uint16_t[]> src(new uint16_t[count]);

                            const char* cur = s.c_str() + basei;
                            for (size_t k = 0; k < count; ++k, cur += 4) {
                                src[k] = (static_cast<uint16_t>(HexOctetToDecimal(cur)) << 8u)  |
                                     static_cast<uint16_t>(HexOctetToDecimal(cur+2));
                            }

                            const size_t dcount = count * 3; // this is enough to hold all possible outputs
                            std::unique_ptr<unsigned char[]> dest(new unsigned char[dcount]);

                            const uint16_t* srct = src.get();
                            unsigned char* destt = dest.get();
                            utf8::utf16to8( srct, srct + count, destt );

                            const size_t outcount = static_cast<size_t>(destt-dest.get());

                            s.erase(i,(j+4-i));

                            ai_assert(sizeof(unsigned char) == 1);
                            s.insert(i, reinterpret_cast<char*>(dest.get()), outcount);

                            i += outcount;
                            continue;
                        }
                        else if (s[i+2] == '4') {
                            if (((j - basei) % 8) != 0) {
                                return false;
                            }

                            const size_t count = (j-basei)/8;
                            std::unique_ptr<uint32_t[]> src(new uint32_t[count]);

                            const char* cur = s.c_str() + basei;
                            for (size_t k = 0; k < count; ++k, cur += 8) {
                                src[k] = (static_cast<uint32_t>(HexOctetToDecimal(cur  )) << 24u) |
                                         (static_cast<uint32_t>(HexOctetToDecimal(cur+2)) << 16u) |
                                         (static_cast<uint32_t>(HexOctetToDecimal(cur+4)) << 8u)  |
                                         (static_cast<uint32_t>(HexOctetToDecimal(cur+6)));
                            }

                            const size_t dcount = count * 5; // this is enough to hold all possible outputs
                            std::unique_ptr<unsigned char[]> dest(new unsigned char[dcount]);

                            const uint32_t* srct = src.get();
                            unsigned char* destt = dest.get();
                            utf8::utf32to8( srct, srct + count, destt );

                            const size_t outcount = static_cast<size_t>(destt-dest.get());

                            s.erase(i,(j+4-i));

                            ai_assert(sizeof(unsigned char) == 1);
                            s.insert(i, reinterpret_cast<char*>(dest.get()), outcount);

                            i += outcount;
                            continue;
                        }
                    }
                    break;

                    // TODO: other encoding patterns?

                default:
                    return false;
                }
            }
        }
        ++i;
    }
    return true;
}